

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cpp
# Opt level: O3

ostream * masc::polygon::operator<<(ostream *os,c_ply *p)

{
  int iVar1;
  pointer pppVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ply_vertex *ppVar4;
  pointer pppVar5;
  char *pcVar6;
  bool bVar7;
  undefined4 extraout_var_01;
  
  pppVar2 = (p->all).
            super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pppVar5 = (p->all).
            super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pppVar2 == pppVar5) {
    c_ply::build_all(p);
    pppVar2 = (p->all).
              super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pppVar5 = (p->all).
              super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  poVar3 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)os,(int)((ulong)((long)pppVar5 - (long)pppVar2) >> 3));
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  bVar7 = p->type == PIN;
  pcVar6 = "out";
  if (bVar7) {
    pcVar6 = "in";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,(ulong)bVar7 ^ 3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  ppVar4 = p->head;
  do {
    iVar1 = (*ppVar4->_vptr_ply_vertex[2])(ppVar4);
    poVar3 = std::ostream::_M_insert<double>(*(double *)CONCAT44(extraout_var,iVar1));
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    iVar1 = (*ppVar4->_vptr_ply_vertex[2])(ppVar4);
    poVar3 = std::ostream::_M_insert<double>(*(double *)(CONCAT44(extraout_var_00,iVar1) + 8));
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    iVar1 = (*ppVar4->_vptr_ply_vertex[3])(ppVar4);
    ppVar4 = (ply_vertex *)CONCAT44(extraout_var_01,iVar1);
  } while (ppVar4 != p->head);
  iVar1 = 1;
  while( true ) {
    pppVar2 = (p->all).
              super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pppVar5 = (p->all).
              super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pppVar2 == pppVar5) {
      c_ply::build_all(p);
      pppVar2 = (p->all).
                super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pppVar5 = (p->all).
                super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    if ((int)((ulong)((long)pppVar5 - (long)pppVar2) >> 3) <= iVar1 + -1) break;
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)os,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    iVar1 = iVar1 + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  return os;
}

Assistant:

ostream& operator<<( ostream& os, c_ply& p)
{
    os<<p.getSize()<<" "<<((p.type==c_ply::PIN)?"in":"out")<<"\n";
    ply_vertex * ptr=p.head;
    do{
        os<<ptr->getPos()[0]<<" "<<ptr->getPos()[1]<<"\n";
        ptr=ptr->getNext();
    }while(ptr!=p.head);

    for(int i=0;i<p.getSize();i++) os<<i+1<<" ";
    os<<"\n";
    return os;
}